

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

bool __thiscall mpt::typed_array<double>::insert(typed_array<double> *this,long pos,double *val)

{
  bool bVar1;
  content<double> *this_00;
  double *pdVar2;
  void *d;
  long len;
  double *val_local;
  long pos_local;
  typed_array<double> *this_local;
  
  d = (void *)unique_array<double>::length(&this->super_unique_array<double>);
  if (pos < 0) {
    val_local = (double *)((long)d + pos);
    if ((long)val_local < 0) {
      return false;
    }
  }
  else {
    val_local = (double *)pos;
    if ((long)d < pos) {
      d = (void *)pos;
    }
  }
  bVar1 = unique_array<double>::reserve(&this->super_unique_array<double>,(long)d + 1);
  if (bVar1) {
    this_00 = reference<mpt::content<double>_>::instance((reference<mpt::content<double>_> *)this);
    pdVar2 = (double *)content<double>::insert(this_00,(long)val_local);
    if (pdVar2 == (double *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      *pdVar2 = *val;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool insert(long pos, const T &val)
	{
		long len = this->length();
		if (pos < 0) {
			if ((pos += len) < 0) {
				return 0;
			}
		}
		else if (pos > len) {
			len = pos;
		}
		if (!this->reserve(len + 1)) {
			return 0;
		}
		void *d = this->_ref.instance()->insert(pos);
		if (d) {
			new (d) T(val);
			return true;
		}
		return false;
	}